

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

int __thiscall QByteArray::toInt(QByteArray *this,bool *ok,int base)

{
  int iVar1;
  undefined4 in_EDX;
  bool *in_RSI;
  int in_stack_0000002c;
  undefined1 in_stack_00000030 [16];
  undefined4 in_stack_ffffffffffffffe8;
  
  qToByteArrayViewIgnoringNull<QByteArray,_true>
            ((QByteArray *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  iVar1 = QtPrivate::toIntegral<int,QByteArrayView,void>
                    ((QByteArrayView)in_stack_00000030,in_RSI,in_stack_0000002c);
  return iVar1;
}

Assistant:

int QByteArray::toInt(bool *ok, int base) const
{
    return QtPrivate::toIntegral<int>(qToByteArrayViewIgnoringNull(*this), ok, base);
}